

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

void xmlNodeDumpOutput(xmlOutputBufferPtr buf,xmlDocPtr doc,xmlNodePtr cur,int level,int format,
                      char *encoding)

{
  int iVar1;
  xmlDtdPtr pxVar2;
  xmlChar *pxVar3;
  xmlSaveCtxt ctxt;
  
  xmlInitParser();
  if (cur != (xmlNodePtr)0x0 && buf != (xmlOutputBufferPtr)0x0) {
    iVar1 = 100;
    if ((uint)level < 100) {
      iVar1 = level;
    }
    if (level < 0) {
      iVar1 = 0;
    }
    pxVar3 = "UTF-8";
    if (encoding != (char *)0x0) {
      pxVar3 = (xmlChar *)encoding;
    }
    memset(&ctxt,0,0x90);
    ctxt.encoding = pxVar3;
    ctxt.buf = buf;
    ctxt.level = iVar1;
    xmlSaveCtxtInit(&ctxt,0x21 - (uint)(format == 0));
    pxVar2 = xmlGetIntSubset(doc);
    if ((pxVar2 != (xmlDtdPtr)0x0) &&
       (iVar1 = xmlIsXHTML(pxVar2->SystemID,pxVar2->ExternalID), 0 < iVar1)) {
      xhtmlNodeDumpOutput(&ctxt,cur);
      return;
    }
    xmlNodeDumpOutputInternal(&ctxt,cur);
  }
  return;
}

Assistant:

void
xmlNodeDumpOutput(xmlOutputBufferPtr buf, xmlDocPtr doc, xmlNodePtr cur,
                  int level, int format, const char *encoding)
{
    xmlSaveCtxt ctxt;
    int options;
#ifdef LIBXML_HTML_ENABLED
    xmlDtdPtr dtd;
    int is_xhtml = 0;
#endif

    (void) doc;

    xmlInitParser();

    if ((buf == NULL) || (cur == NULL)) return;

    if (level < 0)
        level = 0;
    else if (level > 100)
        level = 100;

    if (encoding == NULL)
        encoding = "UTF-8";

    memset(&ctxt, 0, sizeof(ctxt));
    ctxt.buf = buf;
    ctxt.level = level;
    ctxt.encoding = (const xmlChar *) encoding;

    options = XML_SAVE_AS_XML;
    if (format)
        options |= XML_SAVE_FORMAT;
    xmlSaveCtxtInit(&ctxt, options);

#ifdef LIBXML_HTML_ENABLED
    dtd = xmlGetIntSubset(doc);
    if (dtd != NULL) {
	is_xhtml = xmlIsXHTML(dtd->SystemID, dtd->ExternalID);
	if (is_xhtml < 0)
	    is_xhtml = 0;
    }

    if (is_xhtml)
        xhtmlNodeDumpOutput(&ctxt, cur);
    else
#endif
        xmlNodeDumpOutputInternal(&ctxt, cur);
}